

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  int iVar1;
  FKey *pFVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  u32 uVar6;
  Index *pIdx;
  Index *local_38;
  
  uVar6 = 0;
  if ((pParse->db->flags & 0x40000) != 0) {
    uVar6 = 0;
    for (pFVar2 = pTab->pFKey; pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextFrom) {
      if (0 < (long)pFVar2->nCol) {
        lVar5 = 0;
        do {
          iVar1 = *(int *)((long)&pFVar2->aCol[0].iFrom + lVar5);
          uVar4 = 1 << ((byte)iVar1 & 0x1f);
          if (0x1f < iVar1) {
            uVar4 = 0xffffffff;
          }
          uVar6 = uVar6 | uVar4;
          lVar5 = lVar5 + 0x10;
        } while ((long)pFVar2->nCol * 0x10 != lVar5);
      }
    }
    for (pFVar2 = sqlite3FkReferences(pTab); pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextTo) {
      local_38 = (Index *)0x0;
      sqlite3FkLocateIndex(pParse,pTab,pFVar2,&local_38,(int **)0x0);
      if ((local_38 != (Index *)0x0) && ((ulong)local_38->nColumn != 0)) {
        uVar3 = 0;
        do {
          uVar4 = 1 << ((byte)local_38->aiColumn[uVar3] & 0x1f);
          if (0x1f < local_38->aiColumn[uVar3]) {
            uVar4 = 0xffffffff;
          }
          uVar6 = uVar6 | uVar4;
          uVar3 = uVar3 + 1;
        } while (local_38->nColumn != uVar3);
      }
    }
  }
  return uVar6;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    int i;
    for(p=pTab->pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nColumn; i++) mask |= COLUMN_MASK(pIdx->aiColumn[i]);
      }
    }
  }
  return mask;
}